

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pagerFlushOnCommit(Pager *pPager,int bCommit)

{
  PCache *pPVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  PgHdr *pPVar5;
  
  if (pPager->tempFile == '\0') {
    uVar4 = 1;
  }
  else {
    uVar4 = 0;
    if ((bCommit != 0) && (pPager->fd->pMethods != (sqlite3_io_methods *)0x0)) {
      pPVar1 = pPager->pPCache;
      lVar2 = (long)pPVar1->szCache;
      if (lVar2 < 0) {
        lVar3 = (lVar2 * -0x400) / ((long)pPVar1->szExtra + (long)pPVar1->szPage);
        lVar2 = 1000000000;
        if (lVar3 < 1000000000) {
          lVar2 = lVar3;
        }
      }
      uVar4 = 0;
      lVar3 = 0;
      for (pPVar5 = pPVar1->pDirty; pPVar5 != (PgHdr *)0x0; pPVar5 = pPVar5->pDirtyNext) {
        lVar3 = lVar3 + 100;
      }
      if ((int)lVar2 != 0) {
        uVar4 = (uint)(0x18 < (int)(lVar3 / (long)(int)lVar2));
      }
    }
  }
  return uVar4;
}

Assistant:

static int pagerFlushOnCommit(Pager *pPager, int bCommit){
  if( pPager->tempFile==0 ) return 1;
  if( !bCommit ) return 0;
  if( !isOpen(pPager->fd) ) return 0;
  return (sqlite3PCachePercentDirty(pPager->pPCache)>=25);
}